

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

bool __thiscall
QIconModeViewBase::doBatchedItemLayout(QIconModeViewBase *this,QListViewLayoutInfo *info,int max)

{
  QListView *pQVar1;
  QSize QVar2;
  int iVar3;
  int row;
  long in_FS_OFFSET;
  QStyleOptionViewItem option;
  QModelIndex local_120;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->items).d.size <= (long)info->last) {
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    pQVar1 = (this->super_QCommonListViewBase).qq;
    (**(code **)(*(long *)&(pQVar1->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(pQVar1,&local_108);
    for (row = (int)(this->items).d.size; row <= info->last; row = row + 1) {
      QCommonListViewBase::modelIndex(&local_120,&this->super_QCommonListViewBase,row);
      QVar2 = QCommonListViewBase::itemSize(&this->super_QCommonListViewBase,&local_108,&local_120);
      local_120.r = 0;
      local_120.c = 0;
      local_120.i._0_2_ = (undefined2)QVar2.wd.m_i;
      if (0x7ffe < QVar2.wd.m_i.m_i) {
        local_120.i._0_2_ = 0x7fff;
      }
      iVar3 = (int)((ulong)((long)QVar2 + -0x100000000) >> 0x20) + 1;
      if (0x7ffe < iVar3) {
        iVar3 = 0x7fff;
      }
      local_120.i._2_2_ = (undefined2)iVar3;
      local_120.m.ptr._0_4_ = 0xffff;
      local_120.i._4_4_ = row;
      QList<QListViewItem>::emplaceBack<QListViewItem_const&>
                (&this->items,(QListViewItem *)&local_120);
    }
    doDynamicLayout(this,info);
    QStyleOptionViewItem::~QStyleOptionViewItem(&local_108);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return max < (this->super_QCommonListViewBase).batchStartRow;
  }
  __stack_chk_fail();
}

Assistant:

bool QIconModeViewBase::doBatchedItemLayout(const QListViewLayoutInfo &info, int max)
{
    if (info.last >= items.size()) {
        //first we create the items
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        for (int row = items.size(); row <= info.last; ++row) {
            QSize size = itemSize(option, modelIndex(row));
            QListViewItem item(QRect(0, 0, size.width(), size.height()), row); // default pos
            items.append(item);
        }
        doDynamicLayout(info);
    }
    return (batchStartRow > max); // done
}